

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O3

int BackwardReferencesLz77
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs)

{
  uint uVar1;
  uint32_t *puVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 in_register_0000000c;
  uint uVar5;
  int iVar6;
  PixOrCopy v;
  uint *puVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  iVar11 = xsize * ysize;
  puVar2 = hash_chain[1].offset_length_;
  if (puVar2 != (uint32_t *)0x0) {
    uVar4 = *(undefined4 *)&hash_chain[1].field_0xc;
    puVar2[0] = hash_chain[1].size_;
    puVar2[1] = uVar4;
  }
  uVar4 = *(undefined4 *)&hash_chain->field_0xc;
  hash_chain[1].size_ = hash_chain->size_;
  *(undefined4 *)&hash_chain[1].field_0xc = uVar4;
  hash_chain[1].offset_length_ = (uint32_t *)&hash_chain->size_;
  iVar12 = 0;
  hash_chain[2].offset_length_ = (uint32_t *)0x0;
  *(undefined8 *)&hash_chain->size_ = 0;
  if (0 < iVar11) {
    iVar6 = -1;
    do {
      uVar1 = *(uint *)(*(long *)CONCAT44(in_register_0000000c,cache_bits) + (long)iVar12 * 4);
      uVar5 = uVar1 & 0xfff;
      if (uVar5 < 4) {
LAB_00145e48:
        v = (PixOrCopy)((ulong)argb[iVar12] << 0x20 | 0x10000);
        uVar5 = 1;
      }
      else {
        iVar3 = uVar5 + iVar12;
        if (iVar11 <= (int)(uVar5 + iVar12)) {
          iVar3 = iVar11 + -1;
        }
        iVar13 = iVar6;
        if (iVar6 < iVar12) {
          iVar13 = iVar12;
        }
        if (iVar13 < iVar3) {
          if (iVar6 <= iVar12) {
            iVar6 = iVar12;
          }
          puVar7 = (uint *)(*(long *)CONCAT44(in_register_0000000c,cache_bits) + (long)iVar6 * 4);
          iVar8 = 0;
          do {
            iVar6 = iVar6 + 1;
            puVar7 = puVar7 + 1;
            uVar9 = *puVar7 & 0xfff;
            if (uVar9 < 4) {
              uVar9 = 1;
            }
            iVar10 = uVar9 + iVar6;
            if (iVar8 < iVar10) {
              if (iVar11 <= iVar10) {
                uVar5 = iVar6 - iVar12;
                break;
              }
              uVar5 = iVar6 - iVar12;
              iVar8 = iVar10;
            }
          } while (iVar6 != iVar3);
          iVar6 = iVar13;
          if (uVar5 == 1) goto LAB_00145e48;
        }
        v = (PixOrCopy)(CONCAT44(uVar1 >> 0xc,uVar5 << 0x10) + 2);
        iVar6 = iVar13;
      }
      VP8LBackwardRefsCursorAdd((VP8LBackwardRefs *)hash_chain,v);
      iVar12 = iVar12 + uVar5;
    } while (iVar12 < iVar11);
  }
  return (int)(*(int *)((long)&hash_chain->offset_length_ + 4) == 0);
}

Assistant:

static int BackwardReferencesLz77(int xsize, int ysize,
                                  const uint32_t* const argb, int cache_bits,
                                  const VP8LHashChain* const hash_chain,
                                  VP8LBackwardRefs* const refs) {
  int i;
  int i_last_check = -1;
  int ok = 0;
  int cc_init = 0;
  const int use_color_cache = (cache_bits > 0);
  const int pix_count = xsize * ysize;
  VP8LColorCache hashers;

  if (use_color_cache) {
    cc_init = VP8LColorCacheInit(&hashers, cache_bits);
    if (!cc_init) goto Error;
  }
  VP8LClearBackwardRefs(refs);
  for (i = 0; i < pix_count;) {
    // Alternative#1: Code the pixels starting at 'i' using backward reference.
    int offset = 0;
    int len = 0;
    int j;
    VP8LHashChainFindCopy(hash_chain, i, &offset, &len);
    if (len >= MIN_LENGTH) {
      const int len_ini = len;
      int max_reach = 0;
      const int j_max =
          (i + len_ini >= pix_count) ? pix_count - 1 : i + len_ini;
      // Only start from what we have not checked already.
      i_last_check = (i > i_last_check) ? i : i_last_check;
      // We know the best match for the current pixel but we try to find the
      // best matches for the current pixel AND the next one combined.
      // The naive method would use the intervals:
      // [i,i+len) + [i+len, length of best match at i+len)
      // while we check if we can use:
      // [i,j) (where j<=i+len) + [j, length of best match at j)
      for (j = i_last_check + 1; j <= j_max; ++j) {
        const int len_j = VP8LHashChainFindLength(hash_chain, j);
        const int reach =
            j + (len_j >= MIN_LENGTH ? len_j : 1);  // 1 for single literal.
        if (reach > max_reach) {
          len = j - i;
          max_reach = reach;
          if (max_reach >= pix_count) break;
        }
      }
    } else {
      len = 1;
    }
    // Go with literal or backward reference.
    assert(len > 0);
    if (len == 1) {
      AddSingleLiteral(argb[i], use_color_cache, &hashers, refs);
    } else {
      VP8LBackwardRefsCursorAdd(refs, PixOrCopyCreateCopy(offset, len));
      if (use_color_cache) {
        for (j = i; j < i + len; ++j) VP8LColorCacheInsert(&hashers, argb[j]);
      }
    }
    i += len;
  }

  ok = !refs->error_;
 Error:
  if (cc_init) VP8LColorCacheClear(&hashers);
  return ok;
}